

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O2

uint8_t * __thiscall MPEGGOPHeader::deserialize(MPEGGOPHeader *this,uint8_t *buf,int64_t buf_size)

{
  bool bVar1;
  uint uVar2;
  BitStreamReader bitReader;
  
  bitReader.super_BitStream.m_totalBits = 0;
  bitReader.super_BitStream.m_buffer = (uint *)0x0;
  bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  bitReader.m_curVal = 0;
  bitReader.m_bitLeft = 0;
  BitStreamReader::setBuffer(&bitReader,buf,buf + buf_size);
  bVar1 = BitStreamReader::getBit(&bitReader);
  this->drop_frame_flag = (uint)bVar1;
  uVar2 = BitStreamReader::getBits(&bitReader,5);
  this->time_code_hours = (uint8_t)uVar2;
  uVar2 = BitStreamReader::getBits(&bitReader,6);
  this->time_code_minutes = (uint8_t)uVar2;
  BitStreamReader::skipBit(&bitReader);
  uVar2 = BitStreamReader::getBits(&bitReader,6);
  this->time_code_seconds = (uint8_t)uVar2;
  uVar2 = BitStreamReader::getBits(&bitReader,6);
  this->time_code_pictures = (uint8_t)uVar2;
  bVar1 = BitStreamReader::getBit(&bitReader);
  this->close_gop = (uint)bVar1;
  bVar1 = BitStreamReader::getBit(&bitReader);
  this->broken_link = (uint)bVar1;
  return (uint8_t *)
         ((long)((int)((((int)bitReader.super_BitStream.m_buffer -
                        (int)bitReader.super_BitStream.m_initBuffer) * 8 - bitReader.m_bitLeft | 7)
                      + 0x21) >> 3) + (long)bitReader.super_BitStream.m_initBuffer);
}

Assistant:

uint8_t* MPEGGOPHeader::deserialize(uint8_t* buf, const int64_t buf_size)
{
    BitStreamReader bitReader{};
    bitReader.setBuffer(buf, buf + buf_size);

    drop_frame_flag = bitReader.getBit();

    time_code_hours = bitReader.getBits<uint8_t>(5);
    time_code_minutes = bitReader.getBits<uint8_t>(6);
    bitReader.skipBit();  // marker bit
    time_code_seconds = bitReader.getBits<uint8_t>(6);
    time_code_pictures = bitReader.getBits<uint8_t>(6);

    close_gop = bitReader.getBit();
    /*broken_link indicate that after editing the
      reference frames of the first B-Frames after GOP I-Frame
      are missing (open gop)*/
    broken_link = bitReader.getBit();

    return skipProcessedBytes(bitReader);
}